

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_attr_set_envmap(exr_context_t ctxt,int part_index,char *name,exr_envmap_t eval)

{
  exr_result_t eVar1;
  uint in_ECX;
  exr_attribute_t **in_RDX;
  int in_ESI;
  exr_attribute_list_t *in_RDI;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  exr_priv_part_t part;
  exr_attribute_list_t *in_stack_00000010;
  exr_result_t rv;
  exr_attribute_t *attr;
  uint8_t val;
  undefined4 in_stack_00000030;
  exr_const_context_t in_stack_ffffffffffffffc0;
  exr_const_context_t c;
  int local_34;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_ECX < 2) {
    if (in_RDI == (exr_attribute_list_t *)0x0) {
      local_34 = 2;
    }
    else {
      internal_exr_lock(in_stack_ffffffffffffffc0);
      if ((in_ESI < 0) || (in_RDI[8].num_alloced <= in_ESI)) {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
        local_34 = (**(code **)(in_RDI + 3))(in_RDI,4,"Part index (%d) out of range",in_ESI);
      }
      else {
        c = (exr_const_context_t)in_RDI[0x13].sorted_entries[in_ESI];
        if ((char)in_RDI->num_attributes == '\0') {
          internal_exr_unlock(c);
          local_34 = (*(code *)in_RDI[2].entries)(in_RDI,8);
        }
        else if ((char)in_RDI->num_attributes == '\x03') {
          internal_exr_unlock(c);
          local_34 = (*(code *)in_RDI[2].entries)(in_RDI,0x15);
        }
        else {
          eVar1 = exr_attr_list_find_by_name
                            ((exr_const_context_t)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
          if (eVar1 == 0xf) {
            if (((char)in_RDI->num_attributes != '\x01') && ((char)in_RDI->num_attributes != '\x04')
               ) {
              internal_exr_unlock(c);
              return 0xf;
            }
            local_34 = exr_attr_list_add((exr_context_t)attr,in_stack_00000010,(char *)part,
                                         unaff_retaddr_00,unaff_retaddr,
                                         (uint8_t **)
                                         CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),
                                         (exr_attribute_t **)CONCAT44(part_index,in_stack_00000030))
            ;
          }
          else {
            if (eVar1 != 0) {
              internal_exr_unlock(c);
              return eVar1;
            }
            local_34 = 0;
            if (iRam0000000000000014 != 7) {
              internal_exr_unlock(c);
              eVar1 = (**(code **)(in_RDI + 3))
                                (in_RDI,0x10,
                                 "\'%s\' requested type \'uc\', but stored attributes is type \'%s\'"
                                 ,in_RDX,uRam0000000000000008);
              return eVar1;
            }
          }
          if (local_34 == 0) {
            uRam0000000000000018 = (char)in_ECX;
          }
          internal_exr_unlock(c);
        }
      }
    }
  }
  else {
    local_34 = (**(code **)(in_RDI + 3))
                         (in_RDI,4,"\'%s\' value for envmap (%d) out of range (%d - %d)",in_RDX,
                          in_ECX,0,2);
  }
  return local_34;
}

Assistant:

exr_result_t
exr_attr_set_envmap (
    exr_context_t ctxt, int part_index, const char* name, exr_envmap_t eval)
{
    uint8_t val = (uint8_t) eval;
    if (eval >= EXR_ENVMAP_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "'%s' value for envmap (%d) out of range (%d - %d)",
            name,
            (int) eval,
            0,
            (int) EXR_ENVMAP_LAST_TYPE);

    {
        ATTR_SET_IMPL (EXR_ATTR_ENVMAP, uc);
    }
}